

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O2

wrapper<std::shared_ptr<i1>,_boost::ext::di::v1_3_0::wrappers::shared<boost::ext::di::v1_3_0::scopes::singleton,_impl1,_std::shared_ptr<impl1>_&>_>
 __thiscall
boost::ext::di::v1_3_0::core::
injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<i1>,boost::ext::di::v1_3_0::core::array<i1,i1,boost::ext::di::v1_3_0::named<$_50::TEMPNAMEPLACEHOLDERVALUE()const::Impl1_2,void>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,i1,impl1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i1,impl1_2,$_50::TEMPNAMEPLACEHOLDERVALUE()const::Impl1_2,void,boost::ext::di::v1_3_0::core::none>>
::operator()(injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<i1>,boost::ext::di::v1_3_0::core::array<i1,i1,boost::ext::di::v1_3_0::named<__50::TEMPNAMEPLACEHOLDERVALUE()const::Impl1_2,void>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,i1,impl1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i1,impl1_2,__50::TEMPNAMEPLACEHOLDERVALUE()const::Impl1_2,void,boost::ext::di::v1_3_0::core::none>>
             *this,type<std::shared_ptr<i1>_> *param_1)

{
  undefined8 in_RAX;
  shared<boost::ext::di::v1_3_0::scopes::singleton,_impl1,_std::shared_ptr<impl1>_&> sVar1;
  impl1 *__p;
  wrapper<std::shared_ptr<i1>,_boost::ext::di::v1_3_0::wrappers::shared<boost::ext::di::v1_3_0::scopes::singleton,_impl1,_std::shared_ptr<impl1>_&>_>
  wVar2;
  
  sVar1.object._1_7_ = (undefined7)((ulong)in_RAX >> 8);
  sVar1.object._0_1_ =
       scopes::singleton::
       scope_impl<impl1,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
       create_impl<impl1,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl1,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<i1>,boost::ext::di::v1_3_0::core::array<i1,i1,boost::ext::di::v1_3_0::named<$_50::operator()()const::Impl1_2,void>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,i1,impl1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i1,impl1_2,$_50::operator()()const::Impl1_2,void,boost::ext::di::v1_3_0:...deduce,i1,impl1_2,$_50::operator()()const::Impl1_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
       ::object;
  if (scopes::singleton::scope_impl<impl1,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
      ::
      create_impl<impl1,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl1,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<i1>,boost::ext::di::v1_3_0::core::array<i1,i1,boost::ext::di::v1_3_0::named<$_50::operator()()const::Impl1_2,void>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,i1,impl1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i1,impl1_2,$_50::operator()()const::Impl1_2,void,boost::ext::di::v1_3_0:...deduce,i1,impl1_2,$_50::operator()()const::Impl1_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
      ::object == '\0') {
    sVar1.object = (shared_ptr<impl1> *)
                   __cxa_guard_acquire(&scopes::singleton::
                                        scope_impl<impl1,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                                        ::
                                        create_impl<impl1,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl1,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<i1>,boost::ext::di::v1_3_0::core::array<i1,i1,boost::ext::di::v1_3_0::named<$_50::operator()()const::Impl1_2,void>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,i1,impl1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i1,impl1_2,$_50::operator()()const::Impl1_2,void,boost::ext::di::v1_3_0:...deduce,i1,impl1_2,$_50::operator()()const::Impl1_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                                        ::object);
    if ((int)sVar1.object != 0) {
      __p = (impl1 *)operator_new(8);
      (__p->super_i1)._vptr_i1 = (_func_int **)&PTR__i1_00116fc8;
      std::__shared_ptr<impl1,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<impl1,void>
                ((__shared_ptr<impl1,(__gnu_cxx::_Lock_policy)2> *)
                 scopes::singleton::
                 scope_impl<impl1,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
                 create_impl<impl1,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl1,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<i1>,boost::ext::di::v1_3_0::core::array<i1,i1,boost::ext::di::v1_3_0::named<$_50::operator()()const::Impl1_2,void>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,i1,impl1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i1,impl1_2,$_50::operator()()const::Impl1_2,void,boost::ext::di::v1_3_0:...deduce,i1,impl1_2,$_50::operator()()const::Impl1_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                 ::object,__p);
      __cxa_atexit(std::__shared_ptr<impl1,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr,
                   scopes::singleton::
                   scope_impl<impl1,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
                   create_impl<impl1,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl1,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<i1>,boost::ext::di::v1_3_0::core::array<i1,i1,boost::ext::di::v1_3_0::named<$_50::operator()()const::Impl1_2,void>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,i1,impl1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i1,impl1_2,$_50::operator()()const::Impl1_2,void,boost::ext::di::v1_3_0:...deduce,i1,impl1_2,$_50::operator()()const::Impl1_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                   ::object,&__dso_handle);
      wVar2.wrapper_.object =
           (shared<boost::ext::di::v1_3_0::scopes::singleton,_impl1,_std::shared_ptr<impl1>_&>)
           __cxa_guard_release(&scopes::singleton::
                                scope_impl<impl1,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                                ::
                                create_impl<impl1,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl1,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<i1>,boost::ext::di::v1_3_0::core::array<i1,i1,boost::ext::di::v1_3_0::named<$_50::operator()()const::Impl1_2,void>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,i1,impl1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i1,impl1_2,$_50::operator()()const::Impl1_2,void,boost::ext::di::v1_3_0:...deduce,i1,impl1_2,$_50::operator()()const::Impl1_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                                ::object);
      return (wrapper<std::shared_ptr<i1>,_boost::ext::di::v1_3_0::wrappers::shared<boost::ext::di::v1_3_0::scopes::singleton,_impl1,_std::shared_ptr<impl1>_&>_>
              )wVar2.wrapper_.object;
    }
  }
  return (wrapper<std::shared_ptr<i1>,_boost::ext::di::v1_3_0::wrappers::shared<boost::ext::di::v1_3_0::scopes::singleton,_impl1,_std::shared_ptr<impl1>_&>_>
          )sVar1.object;
}

Assistant:

auto create_impl(const TProvider& provider) {
      static std::shared_ptr<T_> object{provider.get()};
      return wrappers::shared<singleton, T_, std::shared_ptr<T_>&>{object};
    }